

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

void protocol_addProperty
               (Protocol *aProtocol,char *name,objc_property_attribute_t *attributes,
               uint attributeCount,BOOL isRequiredProperty,BOOL isInstanceProperty)

{
  objc_property_list *poVar1;
  objc_property_list **local_98;
  objc_property_list **local_90;
  objc_property_list **local_88;
  undefined1 local_68 [8];
  objc_property p;
  int index;
  objc_property_list *list;
  objc_property_list **listPtr;
  BOOL isInstanceProperty_local;
  BOOL isRequiredProperty_local;
  uint attributeCount_local;
  objc_property_attribute_t *attributes_local;
  char *name_local;
  Protocol *aProtocol_local;
  
  if ((((aProtocol != (Protocol *)0x0) && (name != (char *)0x0)) &&
      ((objc_class *)aProtocol->isa == &_OBJC_CLASS___IncompleteProtocol)) &&
     (isInstanceProperty != '\0')) {
    if (isInstanceProperty == '\0') {
      if (isRequiredProperty == '\0') {
        local_98 = &aProtocol->optional_class_properties;
      }
      else {
        local_98 = &aProtocol->class_properties;
      }
      local_90 = local_98;
    }
    else {
      if (isRequiredProperty == '\0') {
        local_88 = &aProtocol->optional_properties;
      }
      else {
        local_88 = &aProtocol->properties;
      }
      local_90 = local_88;
    }
    if (*local_90 == (objc_property_list *)0x0) {
      poVar1 = (objc_property_list *)calloc(1,0x38);
      *local_90 = poVar1;
      (*local_90)->size = 0x28;
      (*local_90)->count = 1;
    }
    else {
      (*local_90)->count = (*local_90)->count + 1;
      poVar1 = (objc_property_list *)realloc(*local_90,(long)(*local_90)->count * 0x28 + 0x10);
      *local_90 = poVar1;
    }
    poVar1 = *local_90;
    p.setter._4_4_ = poVar1->count + -1;
    propertyFromAttrs((objc_property *)local_68,attributes,attributeCount,name);
    if (poVar1->size != 0x28) {
      __assert_fail("list->size == sizeof(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/protocol.c"
                    ,0x28d,
                    "void protocol_addProperty(Protocol *, const char *, const objc_property_attribute_t *, unsigned int, BOOL, BOOL)"
                   );
    }
    memcpy((void *)((long)poVar1 + (long)p.setter._4_4_ * 0x28 + 0x10),local_68,0x28);
  }
  return;
}

Assistant:

void protocol_addProperty(Protocol *aProtocol,
                          const char *name,
                          const objc_property_attribute_t *attributes,
                          unsigned int attributeCount,
                          BOOL isRequiredProperty,
                          BOOL isInstanceProperty)
{
	if ((NULL == aProtocol) || (NULL == name)) { return; }
	if (aProtocol->isa != (id)&_OBJC_CLASS___IncompleteProtocol) { return; }
	if (!isInstanceProperty) { return; }
	struct objc_property_list **listPtr = 
	    isInstanceProperty ?
	        (isRequiredProperty ? &aProtocol->properties : &aProtocol->optional_properties) :
	        (isRequiredProperty ? &aProtocol->class_properties : &aProtocol->optional_class_properties);
	if (NULL == *listPtr)
	{
		*listPtr = calloc(1, sizeof(struct objc_property_list) + sizeof(struct objc_property));
		(*listPtr)->size = sizeof(struct objc_property);
		(*listPtr)->count = 1;
	}
	else
	{
		(*listPtr)->count++;
		*listPtr = realloc(*listPtr, sizeof(struct objc_property_list) +
				sizeof(struct objc_property) * (*listPtr)->count);
	}
	struct objc_property_list *list = *listPtr;
	int index = list->count-1;
	struct objc_property p = propertyFromAttrs(attributes, attributeCount, name);
	assert(list->size == sizeof(p));
	memcpy(&(list->properties[index]), &p, sizeof(p));
}